

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

void __thiscall particleSamples::perform_particle_reconstruction(particleSamples *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar13;
  reference ppvVar14;
  value_type *pvVar15;
  reference pvVar16;
  size_type sVar17;
  void *pvVar18;
  vector<particle_info,_std::allocator<particle_info>_> *this_00;
  value_type *__x;
  int __x_00;
  long in_RDI;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double extraout_XMM0_Qa;
  double dVar23;
  particle_info *mother;
  double spatial_distance;
  double invariant_mass;
  double pz;
  double py;
  double px;
  double E;
  double z_2;
  double y_2;
  double x_2;
  double t_2;
  double pz_2;
  double py_2;
  double px_2;
  double E_2;
  uint j;
  double z_1;
  double y_1;
  double x_1;
  double t_1;
  double pz_1;
  double py_1;
  double px_1;
  double E_1;
  uint i;
  uint iev;
  double particle_width;
  double particle_mass;
  uint local_64;
  uint local_20;
  uint local_1c;
  
  if (*(int *)(in_RDI + 0x610) == 0x14d) {
    local_1c = 0;
    while( true ) {
      this_00 = (vector<particle_info,_std::allocator<particle_info>_> *)(ulong)local_1c;
      pvVar13 = (vector<particle_info,_std::allocator<particle_info>_> *)
                std::
                vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                ::size(*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                         **)(in_RDI + 0x6c0));
      if (pvVar13 <= this_00) break;
      local_20 = 0;
      while( true ) {
        __x = (value_type *)(ulong)local_20;
        ppvVar14 = std::
                   vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                  **)(in_RDI + 0x6c0),(ulong)local_1c);
        pvVar15 = (value_type *)
                  std::vector<particle_info,_std::allocator<particle_info>_>::size(*ppvVar14);
        if (pvVar15 <= __x) break;
        ppvVar14 = std::
                   vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                  **)(in_RDI + 0x6c0),(ulong)local_1c);
        pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                            (*ppvVar14,(ulong)local_20);
        dVar1 = pvVar16->E;
        ppvVar14 = std::
                   vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                  **)(in_RDI + 0x6c0),(ulong)local_1c);
        pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                            (*ppvVar14,(ulong)local_20);
        dVar2 = pvVar16->px;
        ppvVar14 = std::
                   vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                  **)(in_RDI + 0x6c0),(ulong)local_1c);
        pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                            (*ppvVar14,(ulong)local_20);
        dVar3 = pvVar16->py;
        ppvVar14 = std::
                   vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                  **)(in_RDI + 0x6c0),(ulong)local_1c);
        pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                            (*ppvVar14,(ulong)local_20);
        dVar4 = pvVar16->pz;
        ppvVar14 = std::
                   vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                  **)(in_RDI + 0x6c0),(ulong)local_1c);
        pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                            (*ppvVar14,(ulong)local_20);
        dVar5 = pvVar16->t;
        ppvVar14 = std::
                   vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                  **)(in_RDI + 0x6c0),(ulong)local_1c);
        pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                            (*ppvVar14,(ulong)local_20);
        dVar6 = pvVar16->x;
        ppvVar14 = std::
                   vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                  **)(in_RDI + 0x6c0),(ulong)local_1c);
        pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                            (*ppvVar14,(ulong)local_20);
        dVar7 = pvVar16->y;
        ppvVar14 = std::
                   vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                  **)(in_RDI + 0x6c0),(ulong)local_1c);
        pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                            (*ppvVar14,(ulong)local_20);
        dVar8 = pvVar16->z;
        local_64 = 0;
        while( true ) {
          ppvVar14 = std::
                     vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                    **)(in_RDI + 0x6c8),(ulong)local_1c);
          sVar17 = std::vector<particle_info,_std::allocator<particle_info>_>::size(*ppvVar14);
          if (sVar17 <= local_64) break;
          ppvVar14 = std::
                     vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                    **)(in_RDI + 0x6c8),(ulong)local_1c);
          pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                              (*ppvVar14,(ulong)local_64);
          dVar19 = pvVar16->E;
          ppvVar14 = std::
                     vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                    **)(in_RDI + 0x6c8),(ulong)local_1c);
          pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                              (*ppvVar14,(ulong)local_64);
          dVar20 = pvVar16->px;
          ppvVar14 = std::
                     vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                    **)(in_RDI + 0x6c8),(ulong)local_1c);
          pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                              (*ppvVar14,(ulong)local_64);
          dVar21 = pvVar16->py;
          ppvVar14 = std::
                     vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                    **)(in_RDI + 0x6c8),(ulong)local_1c);
          pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                              (*ppvVar14,(ulong)local_64);
          dVar22 = pvVar16->pz;
          ppvVar14 = std::
                     vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                    **)(in_RDI + 0x6c8),(ulong)local_1c);
          pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                              (*ppvVar14,(ulong)local_64);
          dVar9 = pvVar16->t;
          ppvVar14 = std::
                     vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                    **)(in_RDI + 0x6c8),(ulong)local_1c);
          pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                              (*ppvVar14,(ulong)local_64);
          dVar10 = pvVar16->x;
          ppvVar14 = std::
                     vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                    **)(in_RDI + 0x6c8),(ulong)local_1c);
          pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                              (*ppvVar14,(ulong)local_64);
          dVar11 = pvVar16->y;
          ppvVar14 = std::
                     vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                    **)(in_RDI + 0x6c8),(ulong)local_1c);
          pvVar13 = *ppvVar14;
          pvVar16 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                              (pvVar13,(ulong)local_64);
          __x_00 = (int)pvVar13;
          dVar12 = pvVar16->z;
          dVar19 = dVar1 + dVar19;
          dVar20 = dVar2 + dVar20;
          dVar21 = dVar3 + dVar21;
          dVar22 = dVar4 + dVar22;
          sqrt(-dVar22 * dVar22 + -dVar21 * dVar21 + dVar19 * dVar19 + -(dVar20 * dVar20));
          std::abs(__x_00);
          if ((extraout_XMM0_Qa < 0.00443) &&
             (dVar23 = sqrt((dVar8 - dVar12) * (dVar8 - dVar12) +
                            (dVar7 - dVar11) * (dVar7 - dVar11) +
                            (dVar5 - dVar9) * (dVar5 - dVar9) + (dVar6 - dVar10) * (dVar6 - dVar10))
             , dVar23 < 0.01)) {
            pvVar18 = operator_new(0x78);
            *(undefined8 *)((long)pvVar18 + 8) = 0x3ff04dd2f1a9fbe7;
            *(double *)((long)pvVar18 + 0x30) = dVar19;
            *(double *)((long)pvVar18 + 0x18) = dVar20;
            *(double *)((long)pvVar18 + 0x20) = dVar21;
            *(double *)((long)pvVar18 + 0x28) = dVar22;
            *(double *)((long)pvVar18 + 0x50) = (dVar5 + dVar9) / 2.0;
            *(double *)((long)pvVar18 + 0x38) = (dVar6 + dVar10) / 2.0;
            *(double *)((long)pvVar18 + 0x40) = (dVar7 + dVar11) / 2.0;
            *(double *)((long)pvVar18 + 0x48) = (dVar8 + dVar12) / 2.0;
            std::
            vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
            ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                           **)(in_RDI + 0x6a0),(ulong)local_1c);
            std::vector<particle_info,_std::allocator<particle_info>_>::push_back(this_00,__x);
          }
          local_64 = local_64 + 1;
        }
        local_20 = local_20 + 1;
      }
      local_1c = local_1c + 1;
    }
  }
  return;
}

Assistant:

void particleSamples::perform_particle_reconstruction() {
    if (particle_monval == 333) {
        // particle of interest is phi(1020)
        double particle_mass = 1.019;
        double particle_width = 0.00443;

        // now we loop over events
        for (unsigned int iev = 0; iev < reconst_list_1->size(); iev++) {
            // we first perfrom the (K^+, K^-) pair
            for (unsigned int i = 0; i < (*reconst_list_1)[iev]->size(); i++) {
                double E_1 = (*(*reconst_list_1)[iev])[i].E;
                double px_1 = (*(*reconst_list_1)[iev])[i].px;
                double py_1 = (*(*reconst_list_1)[iev])[i].py;
                double pz_1 = (*(*reconst_list_1)[iev])[i].pz;
                double t_1 = (*(*reconst_list_1)[iev])[i].t;
                double x_1 = (*(*reconst_list_1)[iev])[i].x;
                double y_1 = (*(*reconst_list_1)[iev])[i].y;
                double z_1 = (*(*reconst_list_1)[iev])[i].z;
                for (unsigned int j = 0; j < (*reconst_list_2)[iev]->size();
                     j++) {
                    double E_2 = (*(*reconst_list_2)[iev])[j].E;
                    double px_2 = (*(*reconst_list_2)[iev])[j].px;
                    double py_2 = (*(*reconst_list_2)[iev])[j].py;
                    double pz_2 = (*(*reconst_list_2)[iev])[j].pz;
                    double t_2 = (*(*reconst_list_2)[iev])[j].t;
                    double x_2 = (*(*reconst_list_2)[iev])[j].x;
                    double y_2 = (*(*reconst_list_2)[iev])[j].y;
                    double z_2 = (*(*reconst_list_2)[iev])[j].z;

                    // compute the invariant mass
                    double E = E_1 + E_2;
                    double px = px_1 + px_2;
                    double py = py_1 + py_2;
                    double pz = pz_1 + pz_2;
                    double invariant_mass =
                        sqrt(E * E - px * px - py * py - pz * pz);
                    if (std::abs(invariant_mass - particle_mass)
                        < particle_width) {
                        // phi(1020) resonance found
                        double spatial_distance = sqrt(
                            (t_1 - t_2) * (t_1 - t_2)
                            + (x_1 - x_2) * (x_1 - x_2)
                            + (y_1 - y_2) * (y_1 - y_2)
                            + (z_1 - z_2) * (z_1 - z_2));
                        if (spatial_distance < 0.01) {
                            // this is a real phi(1020)
                            particle_info *mother = new particle_info;
                            mother->mass = particle_mass;
                            mother->E = E;
                            mother->px = px;
                            mother->py = py;
                            mother->pz = pz;
                            mother->t = (t_1 + t_2) / 2.;
                            mother->x = (x_1 + x_2) / 2.;
                            mother->y = (y_1 + y_2) / 2.;
                            mother->z = (z_1 + z_2) / 2.;
                            (*particle_list)[iev]->push_back(*mother);
                        }
                    }
                }
            }
        }
    }
}